

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dill_util.c
# Opt level: O3

void extend_params(dill_stream_conflict s,int argno)

{
  size_t sVar1;
  dill_reg **ppdVar2;
  arg_info_list paVar3;
  dill_parameter_type **ppdVar4;
  long lVar5;
  long lVar6;
  private_ctx pdVar7;
  int iVar8;
  
  pdVar7 = s->p;
  if (pdVar7->c_param_count == 0) {
    sVar1 = (long)argno * 8 + 0x10;
    ppdVar2 = (dill_reg **)dill_malloc(sVar1);
    s->p->c_param_regs = ppdVar2;
    paVar3 = (arg_info_list)dill_malloc(((long)argno * 4 + 8) * 5);
    s->p->c_param_args = paVar3;
    ppdVar4 = (dill_parameter_type **)dill_malloc(sVar1);
  }
  else {
    if (argno + 1 < pdVar7->c_param_count) goto LAB_00106e14;
    sVar1 = (long)argno * 8 + 0x10;
    ppdVar2 = (dill_reg **)dill_realloc(pdVar7->c_param_regs,sVar1);
    pdVar7 = s->p;
    pdVar7->c_param_regs = ppdVar2;
    paVar3 = (arg_info_list)dill_realloc(pdVar7->c_param_args,((long)argno * 4 + 8) * 5);
    pdVar7 = s->p;
    pdVar7->c_param_args = paVar3;
    ppdVar4 = (dill_parameter_type **)dill_realloc(pdVar7->c_param_structs,sVar1);
  }
  pdVar7 = s->p;
  pdVar7->c_param_structs = ppdVar4;
LAB_00106e14:
  iVar8 = pdVar7->c_param_count;
  lVar5 = (long)iVar8;
  if (iVar8 <= argno) {
    lVar6 = lVar5 * 0x14;
    iVar8 = (argno + 1) - iVar8;
    do {
      s->p->c_param_regs[lVar5] = (dill_reg *)0x0;
      pdVar7 = s->p;
      paVar3 = pdVar7->c_param_args;
      *(undefined2 *)(&paVar3->type + lVar6) = 0xb;
      (&paVar3->is_immediate)[lVar6] = '\0';
      *(undefined8 *)((long)&paVar3->in_reg + lVar6) = 0;
      *(undefined4 *)((long)&paVar3->offset + lVar6) = 0;
      pdVar7->c_param_structs[lVar5] = (dill_parameter_type *)0x0;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x14;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    pdVar7 = s->p;
  }
  pdVar7->c_param_count = argno + 1;
  return;
}

Assistant:

static void
extend_params(dill_stream s, int argno)
{
    int i;
    if (s->p->c_param_count == 0) {
        s->p->c_param_regs =
            malloc(sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args =
            malloc(sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            malloc(sizeof(s->p->c_param_structs[0]) * (argno + 2));
    } else if (s->p->c_param_count <= (argno + 1)) {
        s->p->c_param_regs = realloc(
            s->p->c_param_regs, sizeof(s->p->c_param_regs[0]) * (argno + 2));
        s->p->c_param_args = realloc(
            s->p->c_param_args, sizeof(s->p->c_param_args[0]) * (argno + 2));
        s->p->c_param_structs =
            realloc(s->p->c_param_structs,
                    sizeof(s->p->c_param_structs[0]) * (argno + 2));
    }
    for (i = s->p->c_param_count; i <= argno; i++) {
        s->p->c_param_regs[i] = NULL;
        s->p->c_param_args[i].type = DILL_V;
        s->p->c_param_args[i].is_register = 0;
        s->p->c_param_args[i].is_immediate = 0;
        s->p->c_param_args[i].in_reg = 0;
        s->p->c_param_args[i].out_reg = 0;
        s->p->c_param_args[i].offset = 0;
        s->p->c_param_structs[i] = NULL;
    }
    s->p->c_param_count = (argno + 1);
}